

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<long_const&,long&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,long *args,long *args_1)

{
  bool bVar1;
  undefined8 in_RCX;
  CfdLogLevel in_ESI;
  CfdSourceLocation *in_RDI;
  undefined8 in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_long,_long>
  *vargs;
  remove_reference_t<long_&> *in_stack_fffffffffffffef8;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *args_01;
  string *__return_storage_ptr__;
  string local_e0;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  CfdLogLevel local_a4;
  CfdSourceLocation *local_a0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_98;
  basic_string_view<char> local_88;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> local_78 [2];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 *local_38;
  string *local_30;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_8;
  
  local_c0 = in_R8;
  local_b8 = in_RCX;
  local_a4 = in_ESI;
  local_a0 = in_RDI;
  bVar1 = IsEnableLogLevel(in_ESI);
  if (bVar1) {
    __return_storage_ptr__ = &local_e0;
    local_38 = &local_b0;
    local_40 = local_b8;
    local_48 = local_c0;
    args_01 = local_78;
    local_30 = __return_storage_ptr__;
    ::fmt::v7::make_args_checked<long_const&,long&,char_const*,char>
              ((char **)__return_storage_ptr__,(remove_reference_t<const_long_&> *)args_01,
               in_stack_fffffffffffffef8);
    local_50 = args_01;
    local_88 = ::fmt::v7::to_string_view<char,_0>((char *)*local_38);
    local_20 = &local_98;
    local_28 = local_50;
    local_18 = local_50;
    local_8 = local_50;
    local_10 = local_20;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_20,0x33,local_50);
    format_str.size_ = local_98.desc_;
    format_str.data_ = (char *)local_88.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_98.field_1.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_88.data_,format_str,args_00);
    WriteLog(local_a0,local_a4,__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_e0);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}